

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O1

void nn_ep_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint extraout_EDX;
  uint extraout_EDX_00;
  int extraout_EDX_01;
  uint uVar1;
  nn_fsm *self_00;
  
  if (*(int *)&self[1].fn == 1) {
    if (src == -2) {
      uVar1 = 0xfffffffe;
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      goto LAB_0011f298;
    }
  }
  else {
    if (*(int *)&self[1].fn == 2) {
      nn_ep_handler_cold_1();
    }
    nn_ep_handler_cold_4();
    type = extraout_EDX;
  }
  uVar1 = type;
  nn_ep_handler_cold_2();
  type = extraout_EDX_00;
LAB_0011f298:
  self_00 = (nn_fsm *)(ulong)(uint)type;
  nn_ep_handler_cold_3();
  if (extraout_EDX_01 != -3 || (uVar1 ^ 0xfffffffe) != 0) {
    if (*(int *)&self_00[1].fn == 3) {
      if ((uVar1 ^ 0xfffffffe) != 0 || extraout_EDX_01 != 1) {
        return;
      }
      *(undefined4 *)&self_00[1].fn = 1;
      nn_fsm_stopped(self_00,1);
      return;
    }
    nn_ep_shutdown_cold_1();
  }
  nn_ep_shutdown_cold_2();
  return;
}

Assistant:

static void nn_ep_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ep *ep;

    ep = nn_cont (self, struct nn_ep, fsm);

    switch (ep->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_EP_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                ep->state = NN_EP_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (ep->state, src, type);
            }

        default:
            nn_fsm_bad_source (ep->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  We don't expect any events in this state. The only thing that can be done */
/*  is closing the endpoint.                                                  */
/******************************************************************************/
    case NN_EP_STATE_ACTIVE:
        nn_fsm_bad_source (ep->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (ep->state, src, type);
    }
}